

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CMemoryFile.cpp
# Opt level: O0

bool __thiscall
irr::io::CMemoryWriteFile::seek(CMemoryWriteFile *this,long finalPos,bool relativeMovement)

{
  bool relativeMovement_local;
  long finalPos_local;
  CMemoryWriteFile *this_local;
  
  if (relativeMovement) {
    if ((*(long *)&(this->super_IWriteFile).field_0x18 + finalPos < 0) ||
       (*(long *)&(this->super_IWriteFile).field_0x10 <
        *(long *)&(this->super_IWriteFile).field_0x18 + finalPos)) {
      return false;
    }
    *(long *)&(this->super_IWriteFile).field_0x18 =
         finalPos + *(long *)&(this->super_IWriteFile).field_0x18;
  }
  else {
    if ((finalPos < 0) || (*(long *)&(this->super_IWriteFile).field_0x10 < finalPos)) {
      return false;
    }
    *(long *)&(this->super_IWriteFile).field_0x18 = finalPos;
  }
  return true;
}

Assistant:

bool CMemoryWriteFile::seek(long finalPos, bool relativeMovement)
{
	if (relativeMovement) {
		if (Pos + finalPos < 0 || Pos + finalPos > Len)
			return false;

		Pos += finalPos;
	} else {
		if (finalPos < 0 || finalPos > Len)
			return false;

		Pos = finalPos;
	}

	return true;
}